

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O2

bool __thiscall
boost::detail::multi_array::
array_iterator<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*,mpl_::size_t<2ul>,boost::detail::multi_array::const_sub_array<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,1ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*>,boost::random_access_traversal_tag>
::
equal<boost::detail::multi_array::array_iterator<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*,mpl_::size_t<2ul>,boost::detail::multi_array::const_sub_array<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,1ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*>,boost::random_access_traversal_tag>const>
          (array_iterator<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*,mpl_::size_t<2ul>,boost::detail::multi_array::const_sub_array<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,1ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*>,boost::random_access_traversal_tag>
           *this,array_iterator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>,_boost::random_access_traversal_tag>
                 *rhs)

{
  __equal<true> *p_Var1;
  bool bVar2;
  unsigned_long *in_RCX;
  
  if ((*(long *)this == rhs->idx_) &&
     (*(matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ***)(this + 8) == rhs->base_)) {
    p_Var1 = *(__equal<true> **)(this + 0x10);
    if (p_Var1 != (__equal<true> *)rhs->extents_) {
      bVar2 = std::__equal<true>::equal<unsigned_long>
                        (p_Var1,(unsigned_long *)(p_Var1 + 0x10),(unsigned_long *)rhs->extents_,
                         in_RCX);
      if (!bVar2) goto LAB_0042dbd6;
    }
    p_Var1 = *(__equal<true> **)(this + 0x18);
    if (p_Var1 != (__equal<true> *)rhs->strides_) {
      bVar2 = std::__equal<true>::equal<long>
                        (p_Var1,(long *)(p_Var1 + 0x10),(long *)rhs->strides_,(long *)in_RCX);
      if (!bVar2) goto LAB_0042dbd6;
    }
    p_Var1 = *(__equal<true> **)(this + 0x20);
    if (p_Var1 != (__equal<true> *)rhs->index_base_) {
      bVar2 = std::__equal<true>::equal<long>
                        (p_Var1,(long *)(p_Var1 + 0x10),(long *)rhs->index_base_,(long *)in_RCX);
      return bVar2;
    }
    bVar2 = true;
  }
  else {
LAB_0042dbd6:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool equal(IteratorAdaptor& rhs) const {
    const std::size_t N = NumDims::value;
    return (idx_ == rhs.idx_) &&
      (base_ == rhs.base_) &&
      ( (extents_ == rhs.extents_) ||
        std::equal(extents_,extents_+N,rhs.extents_) ) &&
      ( (strides_ == rhs.strides_) ||
        std::equal(strides_,strides_+N,rhs.strides_) ) &&
      ( (index_base_ == rhs.index_base_) ||
        std::equal(index_base_,index_base_+N,rhs.index_base_) );
  }